

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-dark.c
# Opt level: O2

void borg_flow_border(int y1,int x1,int y2,int x2,_Bool stop)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = (long)x1;
  lVar4 = (long)y1;
  lVar2 = lVar4 * 0xc6;
  lVar5 = lVar2 + lVar1;
  lVar3 = lVar2 + x2;
  for (; lVar4 <= y2; lVar4 = lVar4 + 1) {
    borg_data_know->data[0][lVar5] = stop;
    borg_data_icky->data[0][lVar5] = stop;
    borg_data_know->data[0][lVar3] = stop;
    borg_data_icky->data[0][lVar3] = stop;
    lVar5 = lVar5 + 0xc6;
    lVar3 = lVar3 + 0xc6;
  }
  lVar2 = lVar2 + lVar1;
  lVar5 = (long)y2 * 0xc6 + lVar1;
  for (; lVar1 <= x2; lVar1 = lVar1 + 1) {
    borg_data_know->data[0][lVar2] = stop;
    borg_data_icky->data[0][lVar2] = stop;
    borg_data_know->data[0][lVar5] = stop;
    borg_data_icky->data[0][lVar5] = stop;
    lVar2 = lVar2 + 1;
    lVar5 = lVar5 + 1;
  }
  return;
}

Assistant:

static void borg_flow_border(int y1, int x1, int y2, int x2, bool stop)
{
    int x, y;

    /* Scan west/east edges */
    for (y = y1; y <= y2; y++) {
        /* Avoid/Clear west edge */
        borg_data_know->data[y][x1] = stop;
        borg_data_icky->data[y][x1] = stop;

        /* Avoid/Clear east edge */
        borg_data_know->data[y][x2] = stop;
        borg_data_icky->data[y][x2] = stop;
    }

    /* Scan north/south edges */
    for (x = x1; x <= x2; x++) {
        /* Avoid/Clear north edge */
        borg_data_know->data[y1][x] = stop;
        borg_data_icky->data[y1][x] = stop;

        /* Avoid/Clear south edge */
        borg_data_know->data[y2][x] = stop;
        borg_data_icky->data[y2][x] = stop;
    }
}